

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O2

bool __thiscall ON_WindowsBitmap::ReadCompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  uint uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  size_t sizeof_palette;
  ON_WindowsBITMAPINFO *pOVar7;
  char *sFormat;
  uint uVar8;
  long lVar9;
  bool bFailedCRC;
  int i;
  short s;
  size_t sizeof_buffer;
  bool local_65;
  uint local_64;
  unsigned_short local_5e;
  uint local_5c;
  size_t local_58;
  ulong local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  Internal_Destroy(this);
  local_64 = 0;
  local_65 = false;
  local_5e = 0;
  bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64);
  if ((((bVar5) &&
       (bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64), uVar8 = local_64, bVar5)) &&
      (bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64), uVar1 = local_64, bVar5)) &&
     (((bVar5 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_5e), uVar2 = local_5e, bVar5 &&
       (bVar5 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_5e), uVar3 = local_5e, bVar5))
      && (bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64), bVar5)))) {
    local_34 = local_64;
    bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64);
    if (bVar5) {
      local_50 = (ulong)local_64;
      bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64);
      if (bVar5) {
        local_38 = local_64;
        bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64);
        if (bVar5) {
          local_3c = local_64;
          bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64);
          if (bVar5) {
            local_5c = local_64;
            bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_64);
            if (bVar5) {
              local_44 = local_64;
              local_40 = (uint)uVar3;
              sizeof_palette = ON_WindowsBitmapHelper_SizeofPalette(local_5c,local_40);
              uVar4 = local_50;
              pOVar7 = ON_WindowsBitmapHelper_AllocBMI(sizeof_palette,local_50);
              this->m_bmi = pOVar7;
              if (pOVar7 != (ON_WindowsBITMAPINFO *)0x0) {
                this->m_bFreeBMI = 1;
                (pOVar7->bmiHeader).biWidth = uVar8;
                (pOVar7->bmiHeader).biHeight = uVar1;
                (pOVar7->bmiHeader).biPlanes = uVar2;
                (pOVar7->bmiHeader).biBitCount = (unsigned_short)local_40;
                (pOVar7->bmiHeader).biCompression = local_34;
                uVar8 = (uint)uVar4;
                (pOVar7->bmiHeader).biSizeImage = uVar8;
                (pOVar7->bmiHeader).biXPelsPerMeter = local_38;
                (pOVar7->bmiHeader).biYPelsPerMeter = local_3c;
                (pOVar7->bmiHeader).biClrUsed = local_5c;
                (pOVar7->bmiHeader).biClrImportant = local_44;
                (pOVar7->bmiHeader).biSize = 0x28;
                iVar6 = ON_WindowsBitmapHelper_PaletteColorCount(local_5c,local_40);
                lVar9 = (long)iVar6;
                if (uVar8 != 0) {
                  this->m_bits = &pOVar7->bmiColors[lVar9].rgbBlue;
                }
                local_58 = 0;
                bVar5 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_58);
                if (bVar5) {
                  if (local_58 == lVar9 * 4 + uVar4 || local_58 == lVar9 * 4) {
                    bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                                      (file,local_58,this->m_bmi->bmiColors,&local_65);
                    if (uVar8 == 0) {
                      return bVar5;
                    }
                    if (!bVar5) {
                      return bVar5;
                    }
                    if (local_58 != lVar9 * 4) {
                      return bVar5;
                    }
                    local_58 = 0;
                    bVar5 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_58);
                    if (!bVar5) {
                      return false;
                    }
                    if (local_58 == local_50) {
                      bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                                        (file,local_50,this->m_bmi->bmiColors + lVar9,&local_65);
                      return bVar5;
                    }
                    sFormat = "ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n"
                    ;
                    iVar6 = 0x3b4;
                  }
                  else {
                    sFormat = "ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n";
                    iVar6 = 0x3bc;
                  }
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bitmap.cpp"
                             ,iVar6,"",sFormat);
                  return false;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_WindowsBitmap::ReadCompressed( ON_BinaryArchive& file )
{
  Internal_Destroy();

  bool bFailedCRC = false;
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif
  memset(&bmiHeader,0,sizeof(bmiHeader));
  int i;
  short s;
  bool rc;

  for(;;)
  {
    i = 0;
    s = 0;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSize = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biWidth = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biHeight = i;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biPlanes = s;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biBitCount = s;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biCompression = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSizeImage = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biXPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biYPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrUsed = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrImportant = i;
    break;
  }


  if ( rc ) 
  {
    bmiHeader.biSize = sizeof(bmiHeader);
    const size_t sizeof_palette = ON_WindowsBitmapHelper_SizeofPalette(bmiHeader.biClrUsed, bmiHeader.biBitCount );
    const size_t sizeof_image   = bmiHeader.biSizeImage;
    m_bmi = ON_WindowsBitmapHelper_AllocBMI(sizeof_palette,sizeof_image);
    if ( !m_bmi )
    {
      rc = false;
    }
    else 
    {
      m_bFreeBMI = 1;
      m_bmi->bmiHeader = bmiHeader;
      m_bmi->bmiHeader.biSize = sizeof(m_bmi->bmiHeader);
      const int color_count = ON_WindowsBitmapHelper_PaletteColorCount(bmiHeader.biClrUsed, bmiHeader.biBitCount );
      if ( sizeof_image > 0 )
        m_bits = (unsigned char*)&m_bmi->bmiColors[color_count];
      size_t sizeof_buffer = 0;
      rc = file.ReadCompressedBufferSize( &sizeof_buffer );
      if (rc)
      {
        const size_t sizeof_colors = color_count*sizeof(*m_bmi->bmiColors);
        if (    sizeof_buffer == sizeof_colors
             || sizeof_buffer == sizeof_colors + sizeof_image
           ) 
        {
          // palette and image bits are compressed into one or two chunks
          rc = file.ReadCompressedBuffer( sizeof_buffer, m_bmi->bmiColors, &bFailedCRC );
          if ( rc && sizeof_image > 0 && sizeof_buffer == sizeof_colors )
          {
            // 28 July 2003
            //     Added support for reading non-contiguous bitmaps
            sizeof_buffer = 0;
            rc = file.ReadCompressedBufferSize( &sizeof_buffer );
            if (rc)
            {
              if ( sizeof_buffer == sizeof_image )
              {
                // image bits are compressed into a separatechunk
                rc = file.ReadCompressedBuffer( sizeof_buffer, &m_bmi->bmiColors[color_count], &bFailedCRC );
              }
              else
              {
                ON_ERROR("ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n");
                rc = false;
              }
            }
          }
        }
        else
        {
          ON_ERROR("ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n");
          rc = false;
        }
      }
    }
  }
  return rc;
}